

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O2

bool __thiscall
chrono::ChShaftsFreewheel::Initialize
          (ChShaftsFreewheel *this,shared_ptr<chrono::ChShaft> *mshaft1,
          shared_ptr<chrono::ChShaft> *mshaft2)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&mshaft1->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&mshaft2->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
  bVar3 = ChShaftsCouple::Initialize
                    (&this->super_ChShaftsCouple,(shared_ptr<chrono::ChShaft> *)&local_40,
                     (shared_ptr<chrono::ChShaft> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if (bVar3) {
    peVar1 = (mshaft1->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar2 = (mshaft2->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this->phase = 0.0;
    ChConstraintTwoGeneric::SetVariables
              (&(this->constraint).super_ChConstraintTwoGeneric,
               &(peVar1->variables).super_ChVariables,&(peVar2->variables).super_ChVariables);
    ChConstraintTwoGenericBoxed::SetBoxedMinMax(&this->constraint,0.0,10000000000.0);
    (*(this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj[6])
              (this,(((this->super_ChShaftsCouple).shaft1)->super_ChPhysicsItem).system);
  }
  return bVar3;
}

Assistant:

bool ChShaftsFreewheel::Initialize(std::shared_ptr<ChShaft> mshaft1, std::shared_ptr<ChShaft> mshaft2) {
    // Parent initialization
    if (!ChShaftsCouple::Initialize(mshaft1, mshaft2))
        return false;

    ChShaft* mm1 = mshaft1.get();
    ChShaft* mm2 = mshaft2.get();

    phase = 0;

    constraint.SetVariables(&mm1->Variables(), &mm2->Variables());
    constraint.SetBoxedMinMax(0, 1e10);

    SetSystem(shaft1->GetSystem());
    return true;
}